

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rco.cpp
# Opt level: O1

void __thiscall RCO::dump(RCO *this,string *outputDirectory)

{
  pointer pcVar1;
  FILE *__s;
  string outputFile;
  char *local_108 [2];
  char local_f8 [16];
  string local_e8;
  char *local_c8 [2];
  char local_b8 [16];
  char *local_a8 [2];
  char local_98 [16];
  char *local_88 [2];
  char local_78 [16];
  char *local_68 [2];
  char local_58 [16];
  char *local_48 [2];
  char local_38 [16];
  
  pcVar1 = (outputDirectory->_M_dataplus)._M_p;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar1,pcVar1 + outputDirectory->_M_string_length);
  std::__cxx11::string::append((char *)local_48);
  mkdir(local_48[0],0x1ff);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  pcVar1 = (outputDirectory->_M_dataplus)._M_p;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,pcVar1,pcVar1 + outputDirectory->_M_string_length);
  std::__cxx11::string::append((char *)local_68);
  mkdir(local_68[0],0x1ff);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  pcVar1 = (outputDirectory->_M_dataplus)._M_p;
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,pcVar1,pcVar1 + outputDirectory->_M_string_length);
  std::__cxx11::string::append((char *)local_88);
  mkdir(local_88[0],0x1ff);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0]);
  }
  pcVar1 = (outputDirectory->_M_dataplus)._M_p;
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_a8,pcVar1,pcVar1 + outputDirectory->_M_string_length);
  std::__cxx11::string::append((char *)local_a8);
  mkdir(local_a8[0],0x1ff);
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0]);
  }
  pcVar1 = (outputDirectory->_M_dataplus)._M_p;
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c8,pcVar1,pcVar1 + outputDirectory->_M_string_length);
  std::__cxx11::string::append((char *)local_c8);
  mkdir(local_c8[0],0x1ff);
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0]);
  }
  pcVar1 = (outputDirectory->_M_dataplus)._M_p;
  local_108[0] = local_f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_108,pcVar1,pcVar1 + outputDirectory->_M_string_length);
  std::__cxx11::string::append((char *)local_108);
  __s = fopen(local_108[0],"wb");
  fwrite("<?xml version=\"1.0\" encoding=\"utf-8\"?>\r\n",0x28,1,__s);
  pcVar1 = (outputDirectory->_M_dataplus)._M_p;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,pcVar1,pcVar1 + outputDirectory->_M_string_length);
  dumpElement(this,(FILE *)__s,&this->mRootElement,0,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  fclose(__s);
  if (local_108[0] != local_f8) {
    operator_delete(local_108[0]);
  }
  return;
}

Assistant:

void RCO::dump(std::string outputDirectory)
{
	createDirectory(outputDirectory + "/");
	createDirectory(outputDirectory + "/xmls/");
	createDirectory(outputDirectory + "/textures/");
	createDirectory(outputDirectory + "/sounds/");
	createDirectory(outputDirectory + "/layouts/");

	std::string outputFile = outputDirectory + "/index.xml";

	FILE *f = fopen(outputFile.c_str(), "wb");

	fprintf(f, "<?xml version=\"1.0\" encoding=\"utf-8\"?>\r\n");
	dumpElement(f, mRootElement, 0, outputDirectory);

	fclose(f);
}